

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void set_qmatrix(CommonQuantParams *quant_params,int segment_id,MACROBLOCKD *xd)

{
  int iVar1;
  _Bool _Var2;
  macroblockd *in_RDX;
  int in_ESI;
  CommonQuantParams *in_RDI;
  int qmlevel;
  int i;
  int qmlevel_ls [3];
  int qmlevel_v;
  int qmlevel_u;
  int qmlevel_y;
  int use_qmatrix;
  int local_48;
  int local_44;
  int local_40;
  int local_38;
  int local_34 [4];
  int local_24;
  int local_20;
  uint local_1c;
  macroblockd *local_18;
  int local_c;
  CommonQuantParams *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  _Var2 = av1_use_qmatrix(in_RDI,in_RDX,in_ESI);
  local_1c = (uint)_Var2;
  if (local_1c == 0) {
    local_40 = 0xf;
  }
  else {
    local_40 = local_8->qmatrix_level_y;
  }
  local_20 = local_40;
  if (local_1c == 0) {
    local_44 = 0xf;
  }
  else {
    local_44 = local_8->qmatrix_level_u;
  }
  local_24 = local_44;
  if (local_1c == 0) {
    local_48 = 0xf;
  }
  else {
    local_48 = local_8->qmatrix_level_v;
  }
  local_34[3] = local_48;
  local_34[0] = local_40;
  local_34[1] = local_44;
  local_34[2] = local_48;
  for (local_38 = 0; local_38 < 3; local_38 = local_38 + 1) {
    iVar1 = local_34[local_38];
    memcpy(local_18->plane[local_38].seg_qmatrix + local_c,local_8->gqmatrix[iVar1] + local_38,0x98)
    ;
    memcpy(local_18->plane[local_38].seg_iqmatrix + local_c,local_8->giqmatrix[iVar1] + local_38,
           0x98);
  }
  return;
}

Assistant:

static void set_qmatrix(const CommonQuantParams *quant_params, int segment_id,
                        MACROBLOCKD *xd) {
  const int use_qmatrix = av1_use_qmatrix(quant_params, xd, segment_id);
  const int qmlevel_y =
      use_qmatrix ? quant_params->qmatrix_level_y : NUM_QM_LEVELS - 1;
  const int qmlevel_u =
      use_qmatrix ? quant_params->qmatrix_level_u : NUM_QM_LEVELS - 1;
  const int qmlevel_v =
      use_qmatrix ? quant_params->qmatrix_level_v : NUM_QM_LEVELS - 1;
  const int qmlevel_ls[MAX_MB_PLANE] = { qmlevel_y, qmlevel_u, qmlevel_v };
  for (int i = 0; i < MAX_MB_PLANE; ++i) {
    const int qmlevel = qmlevel_ls[i];
    memcpy(&xd->plane[i].seg_qmatrix[segment_id],
           quant_params->gqmatrix[qmlevel][i],
           sizeof(quant_params->gqmatrix[qmlevel][i]));
    memcpy(&xd->plane[i].seg_iqmatrix[segment_id],
           quant_params->giqmatrix[qmlevel][i],
           sizeof(quant_params->giqmatrix[qmlevel][i]));
  }
}